

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KUtils.h
# Opt level: O3

KString * KDIS::UTILS::IndentString
                    (KString *__return_storage_ptr__,KString *S,KUINT16 Tabs,KCHAR8 Tab)

{
  ulong uVar1;
  KString *pKVar2;
  ulong uVar3;
  ushort uVar4;
  KStringStream NewS;
  char local_1b1;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1b1 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1b1,1);
  uVar1 = S->_M_string_length;
  if (uVar1 != 0) {
    uVar4 = 1;
    uVar3 = 0;
    do {
      local_1b1 = (S->_M_dataplus)._M_p[uVar3];
      if (uVar1 - 1 == uVar3 || local_1b1 != '\n') {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1b1,1);
      }
      else {
        local_1b1 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1b1,1);
        local_1b1 = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1b1,1);
      }
      uVar3 = (ulong)uVar4;
      uVar1 = S->_M_string_length;
      uVar4 = uVar4 + 1;
    } while (uVar3 < uVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  pKVar2 = (KString *)std::ios_base::~ios_base(local_130);
  return pKVar2;
}

Assistant:

static inline KString IndentString( const KString & S, KUINT16 Tabs = 1, KCHAR8 Tab = '\t' )
{
    KStringStream NewS;

    // Add tab to first item and then check all new lines
    AddTabsToStringStream( NewS, Tabs, Tab );

    for( KUINT16 i = 0; i < S.size(); ++i )
    {
        if( S.c_str()[i] == '\n' && i != ( S.size() - 1 ) )
        {
            NewS << S.c_str()[i];
            AddTabsToStringStream( NewS, Tabs, Tab );
        }
        else
        {
            NewS << S.c_str()[i];
        }
    }

    return NewS.str();
}